

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O1

bool dxil_spv::analyze_magic_ags_instruction(Impl *impl)

{
  AgsInstruction *__dest;
  CallInst **ppCVar1;
  CallInst **ppCVar2;
  uint uVar3;
  CallInst *pCVar4;
  CallInst *pCVar5;
  CallInst *pCVar6;
  CallInst *pCVar7;
  bool bVar8;
  bool bVar9;
  Id type_id;
  ulong in_RAX;
  uint32_t uVar10;
  ulong uVar11;
  bool bVar12;
  uint32_t output_immediate;
  undefined8 uStack_28;
  
  uVar3 = (impl->ags).num_instructions;
  bVar8 = true;
  if (uVar3 == 0) {
    return true;
  }
  type_id = 0;
  uStack_28 = in_RAX;
  switch((impl->ags).instructions[0].opcode) {
  case 0x28:
    uVar10 = 0;
    bVar12 = uVar3 == 0x15;
    if (!bVar12) goto LAB_0017ccdf;
    type_id = get_matmul_result_type(impl,(impl->ags).instructions[0xc].immediate & 0x7f);
    goto LAB_0017ccd6;
  case 0x29:
  case 0x2d:
    uVar10 = 0;
    bVar12 = uVar3 == 10;
    if (!bVar12) goto LAB_0017ccdf;
    uVar10 = (impl->ags).instructions[1].immediate;
    break;
  default:
    bVar12 = false;
    uVar10 = 0;
    type_id = 0;
    goto LAB_0017ccdf;
  case 0x2f:
    uVar10 = 0;
    bVar12 = uVar3 == 0xd;
    if (!bVar12) goto LAB_0017ccdf;
    uVar10 = (impl->ags).instructions[4].immediate;
    break;
  case 0x32:
    if ((5 < uVar3) && ((impl->ags).current_phase == 1)) {
      __dest = (impl->ags).instructions;
      uVar11 = (ulong)(uVar3 - 5);
      memmove(__dest,__dest + uVar11,0x3c);
      pCVar4 = (impl->ags).backdoor_instructions[uVar11 + 4];
      ppCVar1 = (impl->ags).backdoor_instructions + uVar11;
      pCVar5 = ppCVar1[1];
      ppCVar2 = (impl->ags).backdoor_instructions + uVar11 + 2;
      pCVar6 = *ppCVar2;
      pCVar7 = ppCVar2[1];
      (impl->ags).backdoor_instructions[0] = *ppCVar1;
      (impl->ags).backdoor_instructions[1] = pCVar5;
      (impl->ags).backdoor_instructions[2] = pCVar6;
      (impl->ags).backdoor_instructions[3] = pCVar7;
      (impl->ags).backdoor_instructions[4] = pCVar4;
      (impl->ags).num_instructions = 5;
    }
    bVar12 = (impl->ags).num_instructions == 0xd;
    uVar10 = 0;
    if (bVar12) {
      uStack_28 = uStack_28 & 0xffffffff;
      bVar9 = get_constant_operand
                        (&(impl->ags).backdoor_instructions[4]->super_Instruction,5,
                         (uint32_t *)((long)&uStack_28 + 4));
      type_id = 0;
      uVar10 = 0;
      if (bVar9) {
        type_id = build_coopmat_type(impl,uStack_28._4_4_);
        uVar10 = 2;
      }
      bVar12 = true;
      if (!bVar9) {
        return false;
      }
    }
    goto LAB_0017ccdf;
  case 0x33:
    uVar10 = 0;
    bVar12 = uVar3 == 9;
    if (!bVar12) goto LAB_0017ccdf;
    type_id = build_coopmat_type(impl,(impl->ags).instructions[0].immediate);
    uVar10 = 1;
    goto LAB_0017ccdd;
  }
  type_id = build_coopmat_type(impl,uVar10);
LAB_0017ccd6:
  uVar10 = 2;
LAB_0017ccdd:
  bVar12 = true;
LAB_0017ccdf:
  if (bVar12) {
    bVar8 = emit_wmma_return_values(impl,type_id,0,uVar10);
  }
  return bVar8;
}

Assistant:

bool analyze_magic_ags_instruction(Converter::Impl &impl)
{
	if (impl.ags.num_instructions == 0)
		return true;

	bool has_wmma_return_values = false;
	spv::Id type_id = 0;
	uint32_t phase = 0;

	switch (impl.ags.instructions[0].opcode)
	{
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixUavLoad:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixLdsLoad:
		has_wmma_return_values = impl.ags.num_instructions == 10;
		if (has_wmma_return_values)
		{
			type_id = build_coopmat_type(impl, impl.ags.instructions[1].immediate);
			phase = 2;
		}
		break;

	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixCopy:
		if (impl.ags.current_phase == 1)
		{
			if (impl.ags.num_instructions > 5)
			{
				// Apparently some shaders encode dummy inputs? Shift away useless stuff either way.
				memmove(impl.ags.instructions, impl.ags.instructions + (impl.ags.num_instructions - 5),
				        5 * sizeof(impl.ags.instructions[0]));
				memmove(impl.ags.backdoor_instructions, impl.ags.backdoor_instructions + (impl.ags.num_instructions - 5),
				        5 * sizeof(impl.ags.backdoor_instructions[0]));
				impl.ags.num_instructions = 5;
			}
		}
		has_wmma_return_values = impl.ags.num_instructions == 13;
		if (has_wmma_return_values)
		{
			uint32_t output_immediate = 0;
			if (!get_constant_operand(impl.ags.backdoor_instructions[4], 5, &output_immediate))
				return false;
			type_id = build_coopmat_type(impl, output_immediate);
			phase = 2;
		}
		break;

	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixMulAcc:
		has_wmma_return_values = impl.ags.num_instructions == 21;
		if (has_wmma_return_values)
		{
			auto opcode = (impl.ags.instructions[12].immediate >> AmdExtD3DShaderIntrinsicsWaveMatrixOpcode_OpsShift) &
			              AmdExtD3DShaderIntrinsicsWaveMatrixOpcode_OpsMask;
			type_id = get_matmul_result_type(impl, opcode);
			phase = 2;
		}
		break;

	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixFill:
		has_wmma_return_values = impl.ags.num_instructions == 9;
		if (has_wmma_return_values)
		{
			type_id = build_coopmat_type(impl, impl.ags.instructions[0].immediate);
			phase = 1;
		}
		break;

	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixElementFill:
		 has_wmma_return_values = impl.ags.num_instructions == 13;
		 if (has_wmma_return_values)
		 {
			 type_id = build_coopmat_type(impl, impl.ags.instructions[4].immediate);
			 phase = 2;
		 }
		 break;

	default:
		break;
	}

	if (has_wmma_return_values)
		return emit_wmma_return_values(impl, type_id, 0, phase);
	else
		return true;
}